

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::setSamplesToZero
          (TypedDeepImageChannel<unsigned_int> *this,size_t i,uint oldNumSamples,uint newNumSamples)

{
  uint j;
  uint newNumSamples_local;
  uint oldNumSamples_local;
  size_t i_local;
  TypedDeepImageChannel<unsigned_int> *this_local;
  
  for (j = oldNumSamples; j < newNumSamples; j = j + 1) {
    this->_sampleListPointers[i][j] = 0;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::setSamplesToZero
    (size_t i,
     unsigned int oldNumSamples,
     unsigned int newNumSamples)
{
    //
    // Expand the size of a sample list for a single pixel and
    // set the new samples in the list to 0.
    //
    // i                The position of the affected pixel in
    //                  the channel's _sampleListPointers.
    //
    // oldNumSamples    Original number of samples in the sample list.
    //
    // newNumSamples    New number of samples in the sample list.
    //

    for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
        _sampleListPointers[i][j] = 0;
}